

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::Dynamic_Object_Function
          (Dynamic_Object_Function *this,string *t_type_name,Proxy_Function *t_func,
          bool t_is_attribute)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *__x;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_40;
  byte local_21;
  __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Stack_20;
  bool t_is_attribute_local;
  Proxy_Function *t_func_local;
  string *t_type_name_local;
  Dynamic_Object_Function *this_local;
  
  local_21 = t_is_attribute;
  p_Stack_20 = (__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)t_func;
  t_func_local = (Proxy_Function *)t_type_name;
  t_type_name_local = (string *)this;
  peVar3 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)t_func);
  __x = Proxy_Function_Base::get_param_types(peVar3);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector(&local_40,__x);
  peVar3 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Stack_20);
  iVar2 = Proxy_Function_Base::get_arity(peVar3);
  Proxy_Function_Base::Proxy_Function_Base(&this->super_Proxy_Function_Base,&local_40,iVar2);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(&local_40);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Object_Function_00877928;
  std::__cxx11::string::string((string *)&this->m_type_name,t_type_name);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr
            (&this->m_func,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)p_Stack_20);
  std::unique_ptr<chaiscript::Type_Info,std::default_delete<chaiscript::Type_Info>>::
  unique_ptr<std::default_delete<chaiscript::Type_Info>,void>
            ((unique_ptr<chaiscript::Type_Info,std::default_delete<chaiscript::Type_Info>> *)
             &this->m_ti);
  user_type<chaiscript::dispatch::Dynamic_Object>();
  this->m_is_attribute = (bool)(local_21 & 1);
  peVar3 = std::
           __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(p_Stack_20);
  iVar2 = Proxy_Function_Base::get_arity(peVar3);
  if (iVar2 < 1) {
    peVar3 = std::
             __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Stack_20);
    iVar2 = Proxy_Function_Base::get_arity(peVar3);
    bVar1 = false;
    if (-1 < iVar2) goto LAB_0071ee4e;
  }
  bVar1 = true;
LAB_0071ee4e:
  if (!bVar1) {
    __assert_fail("(t_func->get_arity() > 0 || t_func->get_arity() < 0) && \"Programming error, Dynamic_Object_Function must have at least one parameter (this)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/../dispatchkit/dynamic_object_detail.hpp"
                  ,0x30,
                  "chaiscript::dispatch::detail::Dynamic_Object_Function::Dynamic_Object_Function(std::string, const Proxy_Function &, bool)"
                 );
  }
  return;
}

Assistant:

Dynamic_Object_Function(std::string t_type_name, const Proxy_Function &t_func, bool t_is_attribute = false)
            : Proxy_Function_Base(t_func->get_param_types(), t_func->get_arity())
            , m_type_name(std::move(t_type_name))
            , m_func(t_func)
            , m_doti(user_type<Dynamic_Object>())
            , m_is_attribute(t_is_attribute) {
          assert((t_func->get_arity() > 0 || t_func->get_arity() < 0)
                 && "Programming error, Dynamic_Object_Function must have at least one parameter (this)");
        }